

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::onEnterFunctionInvocationExpressionAstNode
          (SemanticAnalyzerRun *this,FunctionInvocationExpressionAstNode *node)

{
  bool bVar1;
  element_type *this_00;
  element_type *variableName;
  shared_ptr<Token> *token;
  allocator<char> local_59;
  string local_58;
  optional<VariableDefinition> local_38;
  FunctionInvocationExpressionAstNode *local_18;
  FunctionInvocationExpressionAstNode *node_local;
  SemanticAnalyzerRun *this_local;
  
  local_18 = node;
  node_local = (FunctionInvocationExpressionAstNode *)this;
  this_00 = std::__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->currentScope);
  variableName = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            &local_18->identifier);
  Scope::find(&local_38,this_00,&variableName->value,true);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
  std::optional<VariableDefinition>::~optional(&local_38);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    token = &local_18->identifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Undefined reference in function invocation.",&local_59);
    reportError(this,token,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return;
}

Assistant:

void onEnterFunctionInvocationExpressionAstNode(FunctionInvocationExpressionAstNode*  node) noexcept override {
    if (!this->currentScope->find(node->identifier->value, true)) {
      this->reportError(node->identifier, "Undefined reference in function invocation.");
    }
  }